

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O3

void telnet_subnegotiation(telnet_t *telnet,int telopt,char *buffer,size_t size)

{
  telnet_error_t tVar1;
  int iVar2;
  size_t sVar3;
  int __fd;
  telnet_event_t ev;
  undefined2 local_58;
  undefined1 local_56 [2];
  undefined1 local_54;
  undefined2 local_53;
  undefined1 local_51;
  telnet_event_t local_50;
  
  if (telopt < 0x200) {
    local_58 = 0xfaff;
    __fd = (int)telnet;
    if (telopt < 0x100) {
      _local_56 = CONCAT21(0xf0ff,(char)telopt);
      sVar3 = size;
      _send(__fd,&local_58,3,(int)size);
      iVar2 = (int)sVar3;
      telnet_send(telnet,buffer,size);
      _send(__fd,local_56 + 1,2,iVar2);
      if ((telopt == 0x56) && ((telnet->flags & 1) != 0)) {
        tVar1 = _init_zlib(telnet,1,1);
        if (tVar1 == TELNET_EOK) {
          local_50.type = TELNET_EV_COMPRESS;
          local_50.iac.cmd = '\x01';
          (*telnet->eh)(telnet,&local_50,telnet->ud);
        }
      }
    }
    else {
      _local_56 = CONCAT12((char)telopt,0xfaff);
      local_53 = 0xfff0;
      local_51 = 0xf0;
      sVar3 = size;
      _send(__fd,&local_58,5,(int)size);
      iVar2 = (int)sVar3;
      telnet_send(telnet,buffer,size);
      _send(__fd,&local_53,3,iVar2);
    }
  }
  else {
    _error(telnet,0x604,"telnet_subnegotiation",TELNET_EBADVAL,0,
           "supplied telopt %d for subnegotiation is greater than 511",telopt);
  }
  return;
}

Assistant:

void telnet_subnegotiation(telnet_t *telnet, int telopt,
		const char *buffer, size_t size) {
	unsigned char bytes[8];

	if (telopt > 511) {
		_error(telnet, __LINE__, __func__, TELNET_EBADVAL, 0,
				"supplied telopt %d for subnegotiation is greater than 511", telopt);
		return;
	}

	if (telopt > 255) {
		/* an EXOPL telopt */

		bytes[0] = TELNET_IAC;
		bytes[1] = TELNET_SB;
		bytes[2] = TELNET_TELOPT_EXOPL;
		bytes[3] = TELNET_SB;
		bytes[4] = (unsigned char)(telopt - 256);
		bytes[5] = TELNET_SE;
		bytes[6] = TELNET_IAC;
		bytes[7] = TELNET_SE;

		_sendu(telnet, bytes, 5);
		telnet_send(telnet, buffer, size);
		_sendu(telnet, bytes + 5, 3);

		return;
	}

	bytes[0] = TELNET_IAC;
	bytes[1] = TELNET_SB;
	bytes[2] = (unsigned char)telopt;
	bytes[3] = TELNET_IAC;
	bytes[4] = TELNET_SE;

	_sendu(telnet, bytes, 3);
	telnet_send(telnet, buffer, size);
	_sendu(telnet, bytes + 3, 2);

#if defined(HAVE_ZLIB)
	/* if we're a proxy and we just sent the COMPRESS2 marker, we must
	 * make sure all further data is compressed if not already.
	 */
	if (telnet->flags & TELNET_FLAG_PROXY &&
			telopt == TELNET_TELOPT_COMPRESS2) {
		telnet_event_t ev;

		if (_init_zlib(telnet, 1, 1) != TELNET_EOK)
			return;

		/* notify app that compression was enabled */
		ev.type = TELNET_EV_COMPRESS;
		ev.compress.state = 1;
		telnet->eh(telnet, &ev, telnet->ud);
	}
#endif /* defined(HAVE_ZLIB) */
}